

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  undefined1 *puVar4;
  Maybe<unsigned_long> MVar5;
  StringPtr a;
  StringPtr b;
  size_t pos_local;
  Iterator iter;
  char *local_80;
  char *pcStack_78;
  StringPtr *local_70;
  long local_68;
  Iterator *local_60;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_58;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_50;
  char **local_48;
  StringPtr *local_40;
  undefined1 local_38;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
  }
  else {
    local_70 = (table->rows).builder.ptr;
    local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 4;
    local_80 = (row->content).ptr;
    pcStack_78 = (char *)(row->content).size_;
    local_48 = &local_80;
    puVar4 = (undefined1 *)&local_70;
    local_60 = (Iterator *)&PTR_search_001c6a58;
    pos_local = pos;
    local_58 = &table->indexes;
    local_50 = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
               puVar4;
    _::BTreeImpl::insert(&iter,(BTreeImpl *)&(table->indexes).erasedCount,(SearchKey *)&local_60);
    if ((ulong)iter.row == 0xe) {
      iter.row = 0xe;
    }
    else {
      uVar1 = (iter.leaf)->rows[iter.row].i;
      if (uVar1 != 0) {
        uVar3 = uVar1 - 1;
        a.content.size_ = (size_t)local_80;
        a.content.ptr = (char *)local_70[uVar3].content.size_;
        b.content.size_ = (size_t)puVar4;
        b.content.ptr = pcStack_78;
        bVar2 = _::anon_unknown_0::StringCompare::matches
                          ((StringCompare *)local_70[uVar3].content.ptr,a,b);
        if (bVar2) {
          uVar1 = (iter.leaf)->rows[iter.row].i;
          *this = (Impl<0UL,_false>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar1 - 1);
          pos = (size_t)extraout_RDX;
          goto LAB_0015b456;
        }
      }
    }
    memmove((iter.leaf)->rows + (ulong)iter.row + 1,(iter.leaf)->rows + iter.row,
            (ulong)(iter.row + 1) * -4 + 0x38);
    (iter.leaf)->rows[iter.row].i = (int)pos + 1;
    local_48 = (char **)&pos_local;
    local_38 = 0;
    *this = (Impl<0UL,_false>)0x0;
    iter.tree._0_1_ = 1;
    local_60 = &iter;
    local_58 = &table->indexes;
    local_50 = table;
    local_40 = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.h:478:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:478:5)>
                 *)&local_60);
    pos = (size_t)extraout_RDX_00;
  }
LAB_0015b456:
  MVar5.ptr.field_1.value = pos;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }